

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::(anonymous_namespace)::GeneratedMessageReflectionSwapTest>
::TestInfo::~TestInfo(TestInfo *this)

{
  TestInfo *this_local;
  
  CodeLocation::~CodeLocation(&this->code_location);
  std::
  unique_ptr<testing::internal::TestMetaFactoryBase<bool>,_std::default_delete<testing::internal::TestMetaFactoryBase<bool>_>_>
  ::~unique_ptr(&this->test_meta_factory);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

TestInfo(const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(std::move(a_code_location)) {}